

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O0

fft_real_object fft_real_init(int N,int sgn)

{
  fft_real_object pfVar1;
  fft_object pfVar2;
  double dVar3;
  double dVar4;
  int local_2c;
  int k;
  double theta;
  double PI;
  fft_real_object obj;
  int sgn_local;
  int N_local;
  
  pfVar1 = (fft_real_object)malloc((long)(N / 2) * 0x10 + 0x18);
  pfVar2 = fft_init(N / 2,sgn);
  pfVar1->cobj = pfVar2;
  for (local_2c = 0; local_2c < N / 2; local_2c = local_2c + 1) {
    dVar3 = ((double)local_2c * 6.283185307179586) / (double)N;
    dVar4 = cos(dVar3);
    pfVar1->twiddle2[local_2c].re = dVar4;
    dVar3 = sin(dVar3);
    pfVar1->twiddle2[local_2c].im = dVar3;
  }
  return pfVar1;
}

Assistant:

fft_real_object fft_real_init(int N, int sgn) {
	fft_real_object obj = NULL;
	fft_type PI, theta;
	int k;
	
	PI = 3.1415926535897932384626433832795;
	
	obj = (fft_real_object) malloc (sizeof(struct fft_real_set) + sizeof(fft_data)* (N/2));
	
	obj->cobj = fft_init(N/2,sgn);
	
	for (k = 0; k < N/2;++k) {
		theta = PI2*k/N;
		obj->twiddle2[k].re = cos(theta);
		obj->twiddle2[k].im = sin(theta);
		
	}


	return obj;
	
	
}